

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,short v)

{
  short v_local;
  LogStream *this_local;
  
  operator<<(this,(int)v);
  return this;
}

Assistant:

LogStream& LogStream::operator<<(short v) {
    *this << static_cast<int>(v);
    return *this;
}